

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hole.c
# Opt level: O0

zip_source_t * open_file(char *fname)

{
  char *pcVar1;
  FILE *__stream;
  char *pcVar2;
  zip_source_t *pzVar3;
  undefined8 uVar4;
  zip_source_t *src;
  zip_error_t error;
  char *fname_local;
  
  error.str = fname;
  zip_error_init(&src);
  pzVar3 = (zip_source_t *)zip_source_file_create(error.str,0,0,&src);
  pcVar2 = error.str;
  __stream = _stderr;
  pcVar1 = progname;
  if (pzVar3 == (zip_source_t *)0x0) {
    uVar4 = zip_error_strerror(&src);
    fprintf(__stream,"%s: can\'t open file %s: %s\n",pcVar1,pcVar2,uVar4);
    zip_error_fini(&src);
    exit(1);
  }
  return pzVar3;
}

Assistant:

static zip_source_t *
open_file(const char *fname) {
    zip_error_t error;
    zip_source_t *src;

    zip_error_init(&error);

    if ((src = zip_source_file_create(fname, 0, 0, &error)) == NULL) {
	fprintf(stderr, "%s: can't open file %s: %s\n", progname, fname, zip_error_strerror(&error));
	zip_error_fini(&error);
	exit(1);
    }

    return src;
}